

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

void deflate_find_min_cost_path(libdeflate_compressor *c,u32 block_length,lz_match *cache_ptr)

{
  deflate_freqs *freqs;
  u32 *freqs_00;
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  uint uVar7;
  ulong uVar8;
  u32 *puVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar13 = (ulong)block_length;
  lVar5 = uVar13 * 8 + 0x63ad44;
  *(undefined4 *)((long)&c->p + uVar13 * 8 + 0x639584) = 0;
  do {
    piVar1 = (int *)((long)(c->freqs).litlen + lVar5 + -0x28);
    uVar2 = cache_ptr[-1].length;
    uVar7 = *piVar1 + *(int *)((long)&c->p + (ulong)cache_ptr[-1].offset * 4 + 0x88d0c4);
    piVar1[-1] = (uint)cache_ptr[-1].offset * 0x200 + 1;
    if (uVar2 == 0) {
      cache_ptr = cache_ptr + -1;
    }
    else {
      uVar8 = (ulong)uVar2 << 2 ^ 0xfffffffffffffffc;
      uVar10 = 3;
      uVar11 = uVar8;
      do {
        uVar2 = *(ushort *)((long)&cache_ptr->offset + uVar11);
        iVar4 = *(int *)((long)&c->p +
                        (ulong)*(byte *)((long)&c->p + (ulong)uVar2 + 0x88e1dc) * 4 + 0x88d8d0);
        uVar3 = *(ushort *)((long)&cache_ptr->length + uVar11);
        do {
          uVar12 = *(int *)((long)&c->p + (ulong)uVar10 * 4 + 0x88d4c4) + iVar4 +
                   (piVar1 + -2)[(ulong)uVar10 * 2];
          if (uVar12 < uVar7) {
            *(uint *)((long)(c->freqs).litlen + lVar5 + -0x2c) = uVar10 | (uint)uVar2 << 9;
            uVar7 = uVar12;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 <= uVar3);
        uVar11 = uVar11 + 4;
      } while (uVar11 != 0xfffffffffffffffc);
      cache_ptr = (lz_match *)((long)&cache_ptr->length + uVar8);
    }
    lVar5 = lVar5 + -8;
    piVar1[-2] = uVar7;
  } while (lVar5 != 0x63ad44);
  freqs = &c->freqs;
  memset(freqs,0,0x500);
  puVar6 = (undefined1 *)((long)&c->p + 0x639584);
  freqs_00 = (c->freqs).offset;
  do {
    uVar7 = *(uint *)(puVar6 + 4) & 0x1ff;
    uVar11 = (ulong)(*(uint *)(puVar6 + 4) >> 9);
    if ((ulong)uVar7 == 1) {
      puVar9 = freqs->litlen + uVar11;
    }
    else {
      puVar9 = (c->freqs).offset + ((ulong)""[uVar7] - 0x1f);
      *puVar9 = *puVar9 + 1;
      puVar9 = freqs_00 + *(byte *)((long)&c->p + uVar11 + 0x88e1dc);
    }
    *puVar9 = *puVar9 + 1;
    puVar6 = puVar6 + (ulong)uVar7 * 8;
  } while (puVar6 != (undefined1 *)((long)&c->p + uVar13 * 8 + 0x639584));
  puVar9 = (c->freqs).litlen + 0x100;
  *puVar9 = *puVar9 + 1;
  deflate_make_huffman_code(0x120,0xe,freqs->litlen,(c->codes).lens.litlen,(u32 *)&c->codes);
  deflate_make_huffman_code(0x20,0xf,freqs_00,(c->codes).lens.offset,(c->codes).codewords.offset);
  return;
}

Assistant:

static void
deflate_find_min_cost_path(struct libdeflate_compressor *c,
			   const u32 block_length,
			   const struct lz_match *cache_ptr)
{
	struct deflate_optimum_node *end_node =
		&c->p.n.optimum_nodes[block_length];
	struct deflate_optimum_node *cur_node = end_node;

	cur_node->cost_to_end = 0;
	do {
		unsigned num_matches;
		u32 literal;
		u32 best_cost_to_end;

		cur_node--;
		cache_ptr--;

		num_matches = cache_ptr->length;
		literal = cache_ptr->offset;

		/* It's always possible to choose a literal. */
		best_cost_to_end = c->p.n.costs.literal[literal] +
				   (cur_node + 1)->cost_to_end;
		cur_node->item = (literal << OPTIMUM_OFFSET_SHIFT) | 1;

		/* Also consider matches if there are any. */
		if (num_matches) {
			const struct lz_match *match;
			u32 len;
			u32 offset;
			u32 offset_slot;
			u32 offset_cost;
			u32 cost_to_end;

			/*
			 * Consider each length from the minimum
			 * (DEFLATE_MIN_MATCH_LEN) to the length of the longest
			 * match found at this position.  For each length, we
			 * consider only the smallest offset for which that
			 * length is available.  Although this is not guaranteed
			 * to be optimal due to the possibility of a larger
			 * offset costing less than a smaller offset to code,
			 * this is a very useful heuristic.
			 */
			match = cache_ptr - num_matches;
			len = DEFLATE_MIN_MATCH_LEN;
			do {
				offset = match->offset;
				offset_slot = c->p.n.offset_slot_full[offset];
				offset_cost =
					c->p.n.costs.offset_slot[offset_slot];
				do {
					cost_to_end = offset_cost +
						c->p.n.costs.length[len] +
						(cur_node + len)->cost_to_end;
					if (cost_to_end < best_cost_to_end) {
						best_cost_to_end = cost_to_end;
						cur_node->item = len |
							(offset <<
							 OPTIMUM_OFFSET_SHIFT);
					}
				} while (++len <= match->length);
			} while (++match != cache_ptr);
			cache_ptr -= num_matches;
		}
		cur_node->cost_to_end = best_cost_to_end;
	} while (cur_node != &c->p.n.optimum_nodes[0]);

	deflate_reset_symbol_frequencies(c);
	deflate_tally_item_list(c, block_length);
	deflate_make_huffman_codes(&c->freqs, &c->codes);
}